

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

void __thiscall cfd::Psbt::SetWitnessUtxoData(Psbt *this,UtxoData *utxo)

{
  Script *in_RDI;
  TxOut txout;
  Script redeem_script;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  OutPoint outpoint;
  undefined1 in_stack_000003df;
  Script *in_stack_000003e0;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *in_stack_000003e8;
  TxOut *in_stack_000003f0;
  OutPoint *in_stack_000003f8;
  UtxoData *in_stack_00000400;
  NetType *in_stack_00000410;
  Script *in_stack_fffffffffffffec8;
  TxOutReference *in_stack_fffffffffffffed0;
  OutPoint *in_stack_fffffffffffffed8;
  Psbt *in_stack_fffffffffffffee0;
  TxOut local_e8;
  Script local_88;
  OutPoint local_38;
  
  cfd::core::OutPoint::OutPoint(&local_38);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)0x3c493e);
  cfd::core::Script::Script(&local_88);
  cfd::core::TxOut::TxOut(&local_e8);
  ConvertFromUtxoData(in_stack_00000400,in_stack_000003f8,in_stack_000003f0,in_stack_000003e8,
                      in_stack_000003e0,(bool)in_stack_000003df,in_stack_00000410);
  cfd::core::TxOutReference::TxOutReference((TxOutReference *)&stack0xfffffffffffffec8,&local_e8);
  SetTxInUtxo(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
              in_stack_fffffffffffffec8,
              (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)in_RDI);
  core::TxOutReference::~TxOutReference((TxOutReference *)0x3c49d6);
  core::TxOut::~TxOut((TxOut *)0x3c49e0);
  core::Script::~Script(in_RDI);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
             in_stack_fffffffffffffed0);
  core::OutPoint::~OutPoint((OutPoint *)0x3c4a07);
  return;
}

Assistant:

void Psbt::SetWitnessUtxoData(const UtxoData& utxo) {
  OutPoint outpoint;
  std::vector<KeyData> key_list;
  Script redeem_script;
  TxOut txout;
  ConvertFromUtxoData(utxo, &outpoint, &txout, &key_list, &redeem_script);
  SetTxInUtxo(outpoint, TxOutReference(txout), redeem_script, key_list);
}